

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O3

string * __thiscall
nivalis::anon_unknown_1::ParenRule::operator()
          (string *__return_storage_ptr__,ParenRule *this,string *s)

{
  pointer pcVar1;
  string *extraout_RAX;
  string *psVar2;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  string tmp;
  vector<unsigned_long,_std::allocator<unsigned_long>_> za;
  allocator_type local_61;
  long *local_60;
  size_type local_58;
  long local_50 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  uVar6 = s->_M_string_length;
  uVar5 = (this->prefix)._M_string_length;
  if (uVar6 < uVar5) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + uVar6);
    return extraout_RAX;
  }
  pcVar1 = (this->prefix)._M_dataplus._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar1,pcVar1 + uVar5);
  std::__cxx11::string::push_back((char)(string *)&local_60);
  std::__cxx11::string::_M_append((char *)&local_60,(ulong)(s->_M_dataplus)._M_p);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_40,local_58,&local_61);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&local_40,local_58);
  *local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = local_58;
  if (1 < local_58) {
    uVar3 = 1;
    lVar4 = -1;
    uVar5 = 0;
    uVar6 = 0;
    do {
      if ((uVar6 < uVar3) ||
         ((uVar6 - uVar3) + 1 <=
          local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3 - uVar5])) {
        uVar5 = uVar6;
        if (uVar6 < uVar3) {
          uVar6 = uVar3;
          uVar5 = uVar3;
        }
        for (; (uVar6 < local_58 &&
               (uVar5 = uVar6,
               *(char *)((long)local_60 + uVar6) == *(char *)((long)local_60 + uVar6 + lVar4)));
            uVar6 = uVar6 + 1) {
          uVar5 = local_58;
        }
        local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] = uVar5 - uVar3;
        uVar6 = uVar5 - 1;
        uVar5 = uVar3;
      }
      else {
        local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] =
             local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3 - uVar5];
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + -1;
    } while (uVar3 < local_58);
  }
  psVar2 = _replace(__return_storage_ptr__,this,s,0,s->_M_string_length,&local_40);
  if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    psVar2 = extraout_RAX_00;
  }
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
    psVar2 = extraout_RAX_01;
  }
  return psVar2;
}

Assistant:

std::string operator()(const std::string & s) const {
        if (s.size() < prefix.size()) return s;
        std::string tmp = prefix; tmp.push_back('\v'); tmp.append(s);
        std::vector<size_t> za(tmp.size());
        za.resize(tmp.size());
        za[0] = tmp.size();
        size_t left = 0, right = 0;
        for (size_t i = 1; i < tmp.size(); ++i) {
            if (right >= i && size_t(za[i - left]) < right - i + 1) za[i] = za[i - left];
            else {
                left = i; right = std::max(i, right);
                while (right < tmp.size() && tmp[right] == tmp[right - left]) ++right;
                za[i] = right - left; --right;
            }
        }
        return _replace(s, 0, s.size(), za);
    }